

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_2e03a1b::ConstPubkeyProvider::ToPrivateString
          (ConstPubkeyProvider *this,SigningProvider *arg,string *ret)

{
  secure_unique_ptr<KeyType> sVar1;
  pointer *__ptr;
  CKeyID *keyid;
  pointer pCVar2;
  long in_FS_OFFSET;
  vector<CKeyID,_std::allocator<CKeyID>_> local_80;
  CKey local_68;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_68.fCompressed = false;
  local_68.keydata._M_t.
  super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>,_true,_true>
        )(__uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
          )0x0;
  if (this->m_xonly == true) {
    local_58._M_dataplus._M_p = *(pointer *)&(this->super_PubkeyProvider).field_0xd;
    local_58._M_string_length = *(size_type *)&this->field_0x15;
    local_58.field_2._M_allocated_capacity = *(undefined8 *)&this->field_0x1d;
    local_58.field_2._8_8_ = *(undefined8 *)&this->field_0x25;
    XOnlyPubKey::GetKeyIDs(&local_80,(XOnlyPubKey *)&local_58);
    if (local_80.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.super__Vector_impl_data
        ._M_start !=
        local_80.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.super__Vector_impl_data
        ._M_finish) {
      pCVar2 = local_80.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        (*arg->_vptr_SigningProvider[5])(arg,pCVar2,&local_68);
        if (local_68.keydata._M_t.
            super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
            .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl !=
            (__uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
             )0x0) break;
        pCVar2 = pCVar2 + 1;
      } while (pCVar2 != local_80.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
                         super__Vector_impl_data._M_finish);
    }
    if (local_80.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_80.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_80.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_80.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  else {
    CPubKey::GetID((CKeyID *)&local_58,(CPubKey *)&(this->super_PubkeyProvider).field_0xc);
    (*arg->_vptr_SigningProvider[5])(arg,&local_58,&local_68);
  }
  sVar1._M_t.
  super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>,_true,_true>
        )(__uniq_ptr_data<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>,_true,_true>
          )local_68.keydata;
  if (local_68.keydata._M_t.
      super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
      .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
       )0x0) {
    EncodeSecret_abi_cxx11_(&local_58,&local_68);
    (anonymous_namespace)::ConstPubkeyProvider::ToPrivateString();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return sVar1._M_t.
         super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
         .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl !=
         (__uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
          )0x0;
}

Assistant:

bool ToPrivateString(const SigningProvider& arg, std::string& ret) const override
    {
        CKey key;
        if (m_xonly) {
            for (const auto& keyid : XOnlyPubKey(m_pubkey).GetKeyIDs()) {
                arg.GetKey(keyid, key);
                if (key.IsValid()) break;
            }
        } else {
            arg.GetKey(m_pubkey.GetID(), key);
        }
        if (!key.IsValid()) return false;
        ret = EncodeSecret(key);
        return true;
    }